

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

int __thiscall
CGameControllerCTF::OnCharacterDeath
          (CGameControllerCTF *this,CCharacter *pVictim,CPlayer *pKiller,int WeaponID)

{
  CFlag *this_00;
  CCharacter *pCVar1;
  CCharacter *pCVar2;
  int i;
  long lVar3;
  uint uVar4;
  
  IGameController::OnCharacterDeath(&this->super_IGameController,pVictim,pKiller,WeaponID);
  lVar3 = 0;
  uVar4 = 0;
  do {
    if (lVar3 == 2) {
      return uVar4;
    }
    this_00 = this->m_apFlags[lVar3];
    if ((pKiller == (CPlayer *)0x0) || (this_00 == (CFlag *)0x0)) {
      if (this_00 != (CFlag *)0x0) goto LAB_0011b5f0;
    }
    else {
      pCVar1 = CPlayer::GetCharacter(pKiller);
      if (pCVar1 != (CCharacter *)0x0) {
        pCVar1 = this_00->m_pCarrier;
        pCVar2 = CPlayer::GetCharacter(pKiller);
        if (pCVar1 == pCVar2) {
          uVar4 = uVar4 | 2;
        }
      }
LAB_0011b5f0:
      if (this_00->m_pCarrier == pVictim) {
        CGameContext::SendGameMsg((this->super_IGameController).m_pGameServer,4,-1);
        CFlag::Drop(this_00);
        if ((pKiller != (CPlayer *)0x0) && (pKiller->m_Team != pVictim->m_pPlayer->m_Team)) {
          pKiller->m_Score = pKiller->m_Score + 1;
        }
        uVar4 = uVar4 | 1;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int CGameControllerCTF::OnCharacterDeath(CCharacter *pVictim, CPlayer *pKiller, int WeaponID)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, WeaponID);
	int HadFlag = 0;

	// drop flags
	for(int i = 0; i < 2; i++)
	{
		CFlag *F = m_apFlags[i];
		if(F && pKiller && pKiller->GetCharacter() && F->GetCarrier() == pKiller->GetCharacter())
			HadFlag |= 2;
		if(F && F->GetCarrier() == pVictim)
		{
			GameServer()->SendGameMsg(GAMEMSG_CTF_DROP, -1);
			F->Drop();

			if(pKiller && pKiller->GetTeam() != pVictim->GetPlayer()->GetTeam())
				pKiller->m_Score++;

			HadFlag |= 1;
		}
	}

	return HadFlag;
}